

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sexp.c
# Opt level: O3

sexp sexp_reverse_op(sexp ctx,sexp self,sexp_sint_t n,sexp ls)

{
  sexp_gc_var_t *n_00;
  ulong uVar1;
  sexp_gc_var_t *extraout_RDX;
  sexp local_28;
  sexp_gc_var_t local_20;
  
  local_20.var = &local_28;
  n_00 = &local_20;
  local_20.next = (ctx->value).context.saves;
  (ctx->value).context.saves = n_00;
  local_28 = (sexp)&DAT_0000023e;
  uVar1 = (ulong)ls & 3;
  while ((uVar1 == 0 && (ls->tag == 6))) {
    local_28 = sexp_cons_op(ctx,self,(sexp_sint_t)n_00,(ls->value).type.name,local_28);
    ls = (ls->value).type.cpl;
    uVar1 = (ulong)ls & 3;
    n_00 = extraout_RDX;
  }
  (ctx->value).context.saves = local_20.next;
  return local_28;
}

Assistant:

sexp sexp_reverse_op (sexp ctx, sexp self, sexp_sint_t n, sexp ls) {
  sexp_gc_var1(res);
  sexp_gc_preserve1(ctx, res);
  for (res=SEXP_NULL; sexp_pairp(ls); ls=sexp_cdr(ls))
    res = sexp_cons(ctx, sexp_car(ls), res);
  sexp_gc_release1(ctx);
  return res;
}